

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O2

void __thiscall
google::protobuf::internal::InternalMetadata::DoSwap<std::__cxx11::string>
          (InternalMetadata *this,string *other)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  if (((ulong)this->ptr_ & 1) == 0) {
    pbVar1 = mutable_unknown_fields_slow<std::__cxx11::string>(this);
  }
  else {
    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (((ulong)this->ptr_ & 0xfffffffffffffffe) + 8);
  }
  std::__cxx11::string::swap((string *)pbVar1);
  return;
}

Assistant:

inline void InternalMetadata::DoSwap<std::string>(std::string* other) {
  mutable_unknown_fields<std::string>()->swap(*other);
}